

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O2

int oss_parse_posix_tz(os_tzinfo_t *info,char *tz,size_t len,int west_is_positive)

{
  os_tzinfo_t *poVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *p;
  char *pcVar4;
  char *p_00;
  int dst_ofs;
  int std_ofs;
  size_t local_88;
  size_t dst_name_len;
  os_tzinfo_t *local_78;
  size_t local_70;
  os_tzrule_t dst_end;
  os_tzrule_t dst_start;
  
  dst_name_len = 0;
  std_ofs = 0;
  dst_ofs = 0;
  dst_start.day = 0;
  dst_start.time = 0;
  dst_end.day = 0;
  dst_end.time = 0;
  dst_start.jday = 0;
  dst_start.yday = 0;
  dst_start.month = 0;
  dst_start.week = 0;
  dst_end.jday = 0;
  dst_end.yday = 0;
  dst_end.month = 0;
  dst_end.week = 0;
  p_00 = tz;
  local_78 = info;
  if (tz != (char *)0x0) {
    while (len != 0) {
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)*p_00 * 2 + 1) & 0x20) == 0) {
        local_88 = len;
        pcVar3 = parse_zone_name((char *)0x0,0,p_00,&local_88);
        local_70 = (long)pcVar3 - (long)tz;
        if (p_00 == pcVar3) {
          return 0;
        }
        p = parse_offset(&std_ofs,pcVar3,&local_88);
        if (p == pcVar3) {
          return 0;
        }
        if (west_is_positive != 0) {
          std_ofs = -std_ofs;
        }
        pcVar3 = p;
        if (local_88 != 0) {
          pcVar3 = parse_zone_name((char *)0x0,0,p,&local_88);
          if ((long)pcVar3 - (long)p != 0) {
            dst_name_len = (long)pcVar3 - (long)p;
            pcVar4 = parse_offset(&dst_ofs,pcVar3,&local_88);
            if (pcVar4 == pcVar3) {
              dst_ofs = std_ofs + 0xe10;
              pcVar3 = pcVar4;
            }
            else {
              pcVar3 = pcVar4;
              if (west_is_positive != 0) {
                dst_ofs = -dst_ofs;
              }
            }
            goto LAB_00120fc5;
          }
        }
        dst_ofs = std_ofs;
        p = (char *)0x0;
LAB_00120fc5:
        if (local_88 != 0) {
          if (*pcVar3 != ',') {
            return 0;
          }
          local_88 = local_88 - 1;
          pcVar4 = parse_dst_rule(&dst_start,pcVar3 + 1,&local_88);
          if (pcVar4 == pcVar3 + 1) {
            return 0;
          }
          if (local_88 == 0) {
            return 0;
          }
          if (*pcVar4 != ',') {
            return 0;
          }
          local_88 = local_88 - 1;
          pcVar3 = parse_dst_rule(&dst_end,pcVar4 + 1,&local_88);
          if (pcVar3 == pcVar4 + 1) {
            return 0;
          }
          if (local_88 != 0) {
            return 0;
          }
        }
        poVar1 = local_78;
        (poVar1->dst_end).month = 0;
        (poVar1->dst_end).week = 0;
        (poVar1->dst_end).day = 0;
        (poVar1->dst_end).time = 0;
        (poVar1->dst_start).day = 0;
        (poVar1->dst_start).time = 0;
        (poVar1->dst_end).jday = 0;
        (poVar1->dst_end).yday = 0;
        (poVar1->dst_start).jday = 0;
        (poVar1->dst_start).yday = 0;
        (poVar1->dst_start).month = 0;
        (poVar1->dst_start).week = 0;
        poVar1->dst_abbr[0] = '\0';
        poVar1->dst_abbr[1] = '\0';
        poVar1->dst_abbr[2] = '\0';
        poVar1->dst_abbr[3] = '\0';
        poVar1->dst_abbr[4] = '\0';
        poVar1->dst_abbr[5] = '\0';
        poVar1->dst_abbr[6] = '\0';
        poVar1->dst_abbr[7] = '\0';
        poVar1->dst_abbr[8] = '\0';
        poVar1->dst_abbr[9] = '\0';
        poVar1->dst_abbr[10] = '\0';
        poVar1->dst_abbr[0xb] = '\0';
        poVar1->dst_abbr[0xc] = '\0';
        poVar1->dst_abbr[0xd] = '\0';
        poVar1->dst_abbr[0xe] = '\0';
        poVar1->dst_abbr[0xf] = '\0';
        poVar1->std_abbr[0] = '\0';
        poVar1->std_abbr[1] = '\0';
        poVar1->std_abbr[2] = '\0';
        poVar1->std_abbr[3] = '\0';
        poVar1->std_abbr[4] = '\0';
        poVar1->std_abbr[5] = '\0';
        poVar1->std_abbr[6] = '\0';
        poVar1->std_abbr[7] = '\0';
        poVar1->std_abbr[8] = '\0';
        poVar1->std_abbr[9] = '\0';
        poVar1->std_abbr[10] = '\0';
        poVar1->std_abbr[0xb] = '\0';
        poVar1->std_abbr[0xc] = '\0';
        poVar1->std_abbr[0xd] = '\0';
        poVar1->std_abbr[0xe] = '\0';
        poVar1->std_abbr[0xf] = '\0';
        local_78->is_dst = 0;
        local_78->std_ofs = std_ofs;
        local_78->dst_ofs = dst_ofs;
        parse_zone_name(local_78->std_abbr,0x10,p_00,&local_70);
        parse_zone_name(poVar1->dst_abbr,0x10,p,&dst_name_len);
        (poVar1->dst_start).jday = dst_start.jday;
        (poVar1->dst_start).yday = dst_start.yday;
        (poVar1->dst_start).month = dst_start.month;
        (poVar1->dst_start).week = dst_start.week;
        (poVar1->dst_start).day = dst_start.day;
        (poVar1->dst_start).time = dst_start.time;
        (poVar1->dst_end).jday = dst_end.jday;
        (poVar1->dst_end).yday = dst_end.yday;
        (poVar1->dst_end).month = dst_end.month;
        (poVar1->dst_end).week = dst_end.week;
        (poVar1->dst_end).day = dst_end.day;
        (poVar1->dst_end).time = dst_end.time;
        return 1;
      }
      tz = tz + 1;
      len = len - 1;
      p_00 = p_00 + 1;
    }
  }
  return 0;
}

Assistant:

int oss_parse_posix_tz(struct os_tzinfo_t *info, const char *tz, size_t len,
                       int west_is_positive)
{
    const char *p;
    const char *std_name = 0, *dst_name = 0;
    size_t std_name_len = 0, dst_name_len = 0;
    int std_ofs = 0, dst_ofs = 0;
    struct os_tzrule_t dst_start, dst_end;

    /* clear the daylight savings start/end dates */
    memset(&dst_start, 0, sizeof(dst_start));
    memset(&dst_end, 0, sizeof(dst_end));

    /* if there's no TZ string, return failure */
    if (tz == 0)
        return FALSE;

    /* skip leading spaces, just in case; if that leaves nothing, fail */
    for ( ; len != 0 && isspace(*tz) ; ++tz, --len) ;
    if (len == 0)
        return FALSE;

    /* parse the standard time name; if that's empty, fail */
    std_name = tz;
    tz = parse_zone_name(0, 0, tz, &len);
    if ((std_name_len = tz - std_name) == 0)
        return FALSE;

    /* parse the offset value */
    p = tz;
    if ((tz = parse_offset(&std_ofs, tz, &len)) == p)
        return FALSE;

    /* if we're using west-positive notation, convert to os_tzinfo_t specs */
    if (west_is_positive)
        std_ofs = -std_ofs;

    /* if we're not done, check for a daylight zone */
    p = tz;
    if (len != 0 && (tz = parse_zone_name(0, 0, tz, &len)) != p)
    {
        /* found a daylight zone name - note it */
        dst_name = p;
        dst_name_len = tz - p;
        
        /* 
         *   check for an optional offset value; if it's not present,
         *   daylight time is implicitly one hour ahead of standard time 
         */
        p = tz;
        if ((tz = parse_offset(&dst_ofs, tz, &len)) == p)
            dst_ofs = std_ofs + 60*60;
        else if (west_is_positive)
            dst_ofs = -dst_ofs;
    }
    else
    {
        /* there's no daylight zone, so just repeat the standard offset */
        dst_ofs = std_ofs;
    }

    /* check for the daylight time start/end dates */
    if (len != 0 && *tz == ',')
    {
        /* parse the start date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_start, tz, &len)) == p)
            return FALSE;

        /* if there's a start date, there has to be an end date */
        if (len == 0 || *tz != ',')
            return FALSE;

        /* parse the end date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_end, tz, &len)) == p)
            return FALSE;
    }
    
    /* we need to be done now, other than trailing spaces */
    for ( ; len != 0 && isspace(*tz) ; ++tz) ;
    if (len != 0)
        return FALSE;

    /* clear the result structure */
    memset(info, 0, sizeof(*info));

    /* set the offsets */
    info->std_ofs = std_ofs;
    info->dst_ofs = dst_ofs;

    /* copy the abbreviation strings */
    parse_zone_name(info->std_abbr, sizeof(info->std_abbr),
                    std_name, &std_name_len);
    parse_zone_name(info->dst_abbr, sizeof(info->dst_abbr),
                    dst_name, &dst_name_len);

    /* copy the daylight start/end rules */
    memcpy(&info->dst_start, &dst_start, sizeof(info->dst_start));
    memcpy(&info->dst_end, &dst_end, sizeof(info->dst_end));

    /* success */
    return TRUE;
}